

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O2

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Consolidate
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  uint uVar1;
  uint *puVar2;
  uint i;
  ulong uVar3;
  uint j;
  long lVar4;
  
  for (uVar3 = 0; uVar3 < this->maxIndex >> 4; uVar3 = uVar3 + 1) {
    puVar2 = this->backingStore[uVar3];
    if (puVar2 != (uint *)0x0) {
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        uVar1 = SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,true>
                          ((SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *)this,
                           puVar2[lVar4]);
        puVar2 = this->backingStore[uVar3];
        puVar2[lVar4] = uVar1;
      }
    }
  }
  this->consolidated = true;
  return;
}

Assistant:

void Consolidate()
    {
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] != nullptr)
            {
                for (indexType j = 0; j < numPerSegment; j++)
                {
                    // We can assumeConsolidated here because everything less than the current index is consolidated
                    backingStore[i][j] = Lookup<false, true>(backingStore[i][j]);
                }
            }
        }
#if DBG
        consolidated = true;
#endif
    }